

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * point_basename(char *path)

{
  char firstbyte;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar2 = G_BACKSLASH_CHAR;
  pcVar1 = G_FORWARD_SLASH_CHAR;
  pcVar4 = path;
  for (; firstbyte = *path, firstbyte != '\0'; path = path + 1) {
    sVar3 = GetUTF8Length(firstbyte);
    if (sVar3 < 2) {
      if ((firstbyte == *pcVar2) || (firstbyte == *pcVar1)) {
        pcVar4 = path + 1;
      }
    }
    else {
      path = path + (sVar3 - 1);
    }
  }
  return pcVar4;
}

Assistant:

char *point_basename(const char *path)
{
	const char *b = path;
	const char *p;
	for (p = b; *p; p++)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			p += step - 1;
			continue;
		}
		if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			b = p + 1;
		}
	}
	return (char *)b;
}